

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

Float pbrt::IntegrateCatmullRom(span<const_float> x,span<const_float> values,span<float> cdf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  size_t vb;
  size_t va;
  
  vb = values.n;
  pfVar6 = values.ptr;
  va = x.n;
  pfVar7 = x.ptr;
  if (va != vb) {
    LogFatal<char_const(&)[9],char_const(&)[14],char_const(&)[9],unsigned_long&,char_const(&)[14],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.cpp"
               ,0xfb,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])"x.size()",
               (char (*) [14])"values.size()",(char (*) [9])"x.size()",&va,
               (char (*) [14])"values.size()",&vb);
  }
  *cdf.ptr = 0.0;
  if (va == 1) {
    auVar9 = ZEXT816(0) << 0x40;
  }
  else {
    auVar9 = ZEXT816(0) << 0x40;
    lVar5 = 0;
    lVar8 = 0;
    do {
      fVar11 = *(float *)((long)pfVar7 + lVar5 + 4);
      fVar1 = *(float *)((long)pfVar6 + lVar5);
      fVar2 = *(float *)((long)pfVar6 + lVar5 + 4);
      fVar3 = fVar11 - *(float *)((long)pfVar7 + lVar5);
      if (lVar5 == 0) {
        fVar11 = fVar2 - fVar1;
      }
      else {
        fVar11 = ((fVar2 - *(float *)((long)pfVar6 + lVar5 + -4)) * fVar3) /
                 (fVar11 - *(float *)((long)pfVar7 + lVar5 + -4));
      }
      if (lVar8 + 2U < va) {
        fVar10 = ((*(float *)((long)pfVar6 + lVar5 + 8) - fVar1) * fVar3) /
                 (*(float *)((long)pfVar7 + lVar5 + 8) - *(float *)((long)pfVar7 + lVar5));
      }
      else {
        fVar10 = fVar2 - fVar1;
      }
      lVar8 = lVar8 + 1;
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)((fVar1 + fVar2) * 0.5)),
                               ZEXT416((uint)(fVar11 - fVar10)),SUB6416(ZEXT464(0x3daaaaab),0));
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar4,auVar9);
      *(int *)((long)cdf.ptr + lVar5 + 4) = auVar9._0_4_;
      lVar5 = lVar5 + 4;
    } while (lVar8 != va - 1);
  }
  return auVar9._0_4_;
}

Assistant:

Float IntegrateCatmullRom(pstd::span<const Float> x, pstd::span<const Float> values,
                          pstd::span<Float> cdf) {
    CHECK_EQ(x.size(), values.size());
    Float sum = 0;
    cdf[0] = 0;
    for (int i = 0; i < x.size() - 1; ++i) {
        // Look up $x_i$ and function values of spline segment _i_
        Float x0 = x[i], x1 = x[i + 1];
        Float f0 = values[i], f1 = values[i + 1];
        Float width = x1 - x0;

        // Approximate derivatives using finite differences
        Float d0, d1;
        if (i > 0)
            d0 = width * (f1 - values[i - 1]) / (x1 - x[i - 1]);
        else
            d0 = f1 - f0;
        if (i + 2 < x.size())
            d1 = width * (values[i + 2] - f0) / (x[i + 2] - x0);
        else
            d1 = f1 - f0;

        // Keep a running sum and build a cumulative distribution function
        sum += ((d0 - d1) * (1.f / 12.f) + (f0 + f1) * .5f) * width;
        cdf[i + 1] = sum;
    }
    return sum;
}